

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.hpp
# Opt level: O2

void __thiscall trng::yarn3::backward(yarn3 *this)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar4 = (this->P).a[2];
  if (iVar4 == 0) {
    iVar4 = (this->P).a[1];
    if (iVar4 == 0) {
      iVar2 = (this->P).a[0];
      if (iVar2 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = (this->S).r[2];
        iVar2 = int_math::modulo_inverse(iVar2,0x7fffffff);
        iVar4 = (int)(((long)iVar2 * (long)iVar4) % 0x7fffffff);
      }
      goto LAB_001cde71;
    }
    iVar3 = (this->S).r[1] - (int)(((long)(this->S).r[2] * (long)(this->P).a[0]) % 0x7fffffff);
    iVar5 = iVar3 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    uVar7 = (ulong)iVar5;
  }
  else {
    iVar3 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffffff);
    iVar5 = iVar3 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    uVar6 = iVar5 - (int)(((long)(this->S).r[2] * (long)(this->P).a[1]) % 0x7fffffff);
    uVar1 = uVar6 + 0x7fffffff;
    if (-1 < (int)uVar6) {
      uVar1 = uVar6;
    }
    uVar7 = (ulong)uVar1;
  }
  iVar2 = int_math::modulo_inverse(iVar4,0x7fffffff);
  iVar4 = (int)((long)((long)iVar2 * uVar7) % 0x7fffffff);
LAB_001cde71:
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  (this->S).r[2] = iVar4;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3::backward() {
    result_type t;
    if (P.a[2] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[2];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = t;
  }